

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icon.c
# Opt level: O3

void set_icon(GLFWwindow *window,int icon_color)

{
  char *pcVar1;
  uchar (*pauVar2) [4];
  long lVar3;
  uchar auVar4 [4];
  long lVar5;
  GLFWimage img;
  uchar pixels [1024];
  GLFWimage local_418;
  uchar local_408 [1032];
  
  local_418.width = 0x10;
  local_418.height = 0x10;
  local_418.pixels = local_408;
  lVar3 = 0;
  pauVar2 = (uchar (*) [4])local_418.pixels;
  do {
    pcVar1 = logo[lVar3];
    lVar5 = 0;
    do {
      auVar4[0] = '\0';
      auVar4[1] = '\0';
      auVar4[2] = '\0';
      auVar4[3] = '\0';
      if (pcVar1[lVar5] == '0') {
        auVar4 = icon_colors[(uint)icon_color];
      }
      *pauVar2 = auVar4;
      pauVar2 = pauVar2 + 1;
      lVar5 = lVar5 + 1;
    } while (lVar5 < 0x10);
    lVar3 = lVar3 + 1;
  } while (lVar3 < 0x10);
  glfwSetWindowIcon(window,1,&local_418);
  return;
}

Assistant:

static void set_icon(GLFWwindow* window, int icon_color)
{
    int x, y;
    unsigned char pixels[16 * 16 * 4];
    unsigned char* target = pixels;
    GLFWimage img = { 16, 16, pixels };

    for (y = 0;  y < img.width;  y++)
    {
        for (x = 0;  x < img.height;  x++)
        {
            if (logo[y][x] == '0')
                memcpy(target, icon_colors[icon_color], 4);
            else
                memset(target, 0, 4);

            target += 4;
        }
    }

    glfwSetWindowIcon(window, 1, &img);
}